

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
* inja::string_view::split
            (pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,string_view view,char Separator)

{
  size_t in_R8;
  string_view view_00;
  string_view view_01;
  string_view local_68;
  string_view *local_58;
  const_pointer local_50;
  string_view local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  size_t idx;
  undefined1 auStack_18 [7];
  char Separator_local;
  string_view view_local;
  
  view_local.data_ = (const_pointer)view.size_;
  _auStack_18 = (string_view *)view.data_;
  idx._7_1_ = Separator;
  local_28 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,Separator,0);
  if (local_28 == 0xffffffffffffffff) {
    nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38);
    std::
    make_pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)auStack_18
               ,&local_38);
  }
  else {
    local_58 = _auStack_18;
    local_50 = view_local.data_;
    view_00.size_ = 0;
    view_00.data_ = view_local.data_;
    local_48 = slice(_auStack_18,view_00,local_28,in_R8);
    view_01.size_ = local_28 + 1;
    view_01.data_ = view_local.data_;
    local_68 = slice(_auStack_18,view_01,0xffffffffffffffff,in_R8);
    std::
    make_pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_48,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<nonstd::string_view, nonstd::string_view> split(nonstd::string_view view, char Separator) {
	size_t idx = view.find(Separator);
	if (idx == nonstd::string_view::npos) {
		return std::make_pair(view, nonstd::string_view());
	}
	return std::make_pair(slice(view, 0, idx), slice(view, idx + 1, nonstd::string_view::npos));
}